

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<QSharedPointer<Data>_>::PromiseResolver
          (PromiseResolver<QSharedPointer<Data>_> *this,QPromise<QSharedPointer<Data>_> *promise)

{
  Data *pDVar1;
  QPromise<QSharedPointer<Data>_> *this_00;
  QPromise<QSharedPointer<Data>_> *promise_local;
  PromiseResolver<QSharedPointer<Data>_> *this_local;
  
  pDVar1 = (Data *)operator_new(0x10);
  QSharedData::QSharedData((QSharedData *)pDVar1);
  pDVar1->promise = (QPromise<QSharedPointer<Data>_> *)0x0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QSharedPointer<Data>_>::Data>::
  QExplicitlySharedDataPointer(&this->m_d,pDVar1);
  this_00 = (QPromise<QSharedPointer<Data>_> *)operator_new(0x10);
  QtPromise::QPromise<QSharedPointer<Data>_>::QPromise(this_00,promise);
  pDVar1 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QSharedPointer<Data>_>::Data>
           ::operator->(&this->m_d);
  pDVar1->promise = this_00;
  return;
}

Assistant:

PromiseResolver(QtPromise::QPromise<T> promise) : m_d{new Data{}}
    {
        m_d->promise = new QtPromise::QPromise<T>{std::move(promise)};
    }